

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alrecord.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  FILE *pFVar5;
  void *__ptr;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  char **ppcVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  void *__ptr_00;
  ulong uVar16;
  char *end;
  undefined8 local_70;
  double local_68;
  char *local_60;
  ulong local_58;
  float local_4c;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_48 = *argv;
  if (argc < 2) {
    iVar14 = 0;
    fprintf(_stderr,
            "Record from a device to a wav file.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
            ,local_48,
            "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
           );
  }
  else {
    ppcVar10 = argv + 1;
    uVar16 = 1;
    if (argc == 2) {
      local_60 = (char *)0x0;
      iVar14 = 1;
    }
    else {
      iVar14 = strcmp(*ppcVar10,"-device");
      if (iVar14 == 0) {
        local_60 = argv[2];
        ppcVar10 = argv + 3;
        iVar14 = argc + -3;
      }
      else {
        iVar14 = argc + -1;
        local_60 = (char *)0x0;
      }
    }
    local_4c = 4.0;
    local_68 = 7.90505033345994e-323;
    local_58 = 0xac44;
    local_40 = "record.wav";
    local_70 = (double)((ulong)local_70._4_4_ << 0x20);
    do {
      iVar2 = (int)uVar16;
      if (iVar14 < 1) goto LAB_00102895;
      pcVar12 = *ppcVar10;
      iVar2 = strcmp(pcVar12,"--");
      if (iVar2 == 0) {
        iVar3 = 3;
      }
      else {
        iVar2 = strcmp(pcVar12,"--channels");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar12,"-c"), iVar2 == 0)) {
          if (iVar14 == 1) {
LAB_001027b1:
            fprintf(_stderr,"Missing argument for option: %s\n",pcVar12);
            iVar14 = 1;
          }
          else {
            uVar16 = strtoul(ppcVar10[1],&end,0);
            if ((0xfffffffd < (int)uVar16 - 3U) &&
               ((pcVar12 = (char *)CONCAT44(end._4_4_,
                                            CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end))),
                pcVar12 == (char *)0x0 || (*pcVar12 == '\0')))) goto LAB_0010279a;
            main_cold_4();
          }
LAB_001027d2:
          iVar3 = 1;
          local_70 = (double)CONCAT44(local_70._4_4_,1);
        }
        else {
          iVar2 = strcmp(pcVar12,"--bits");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar12,"-b"), iVar2 == 0)) {
            if (iVar14 == 1) goto LAB_001027b1;
            local_68 = (double)strtoul(ppcVar10[1],&end,0);
            if (((0x20 < SUB84(local_68,0)) || ((0x100010100U >> ((ulong)local_68 & 0x3f) & 1) == 0)
                ) || ((pcVar12 = (char *)CONCAT44(end._4_4_,
                                                  CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)))
                      , pcVar12 != (char *)0x0 && (*pcVar12 != '\0')))) {
              main_cold_3();
              goto LAB_001027d2;
            }
          }
          else {
            iVar2 = strcmp(pcVar12,"--rate");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar12,"-r"), iVar2 == 0)) {
              if (iVar14 == 1) goto LAB_001027b1;
              local_58 = strtoul(ppcVar10[1],&end,0);
              if ((88000 < (int)local_58 - 8000U) ||
                 ((pcVar12 = (char *)CONCAT44(end._4_4_,
                                              CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end))),
                  pcVar12 != (char *)0x0 && (*pcVar12 != '\0')))) {
                main_cold_2();
                goto LAB_001027d2;
              }
            }
            else {
              iVar2 = strcmp(pcVar12,"--time");
              if ((iVar2 == 0) || (iVar2 = strcmp(pcVar12,"-t"), iVar2 == 0)) {
                if (iVar14 == 1) goto LAB_001027b1;
                local_4c = strtof(ppcVar10[1],&end);
                if (((local_4c < 1.0) || (10.0 < local_4c)) ||
                   ((pcVar12 = (char *)CONCAT44(end._4_4_,
                                                CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end))),
                    pcVar12 != (char *)0x0 && (*pcVar12 != '\0')))) {
                  main_cold_1();
                  goto LAB_001027d2;
                }
              }
              else {
                iVar2 = strcmp(pcVar12,"--outfile");
                if ((iVar2 != 0) && (iVar2 = strcmp(pcVar12,"-o"), iVar2 != 0)) {
                  iVar2 = strcmp(pcVar12,"--help");
                  if ((iVar2 == 0) || (iVar2 = strcmp(pcVar12,"-h"), iVar2 == 0)) {
                    local_70 = (double)((ulong)local_70 & 0xffffffff00000000);
                    fprintf(_stderr,
                            "Record from a device to a wav file.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
                            ,local_48,
                            "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
                           );
                  }
                  else {
                    local_70 = (double)((ulong)local_70 & 0xffffffff00000000);
                    fprintf(_stderr,
                            "Invalid option \'%s\'.\n\nUsage: %s [-device <name>] [options...]\n\nAvailable options:\n%s\n"
                            ,pcVar12,local_48,
                            "    --channels/-c <channels>  Set channel count (1 or 2)\n    --bits/-b <bits>          Set channel count (8, 16, or 32)\n    --rate/-r <rate>          Set sample rate (8000 to 96000)\n    --time/-t <time>          Time in seconds to record (1 to 10)\n    --outfile/-o <filename>   Output filename (default: record.wav)"
                           );
                  }
                  iVar3 = 1;
                  goto LAB_001027a4;
                }
                if (iVar14 == 1) goto LAB_001027b1;
                local_40 = ppcVar10[1];
              }
            }
          }
LAB_0010279a:
          iVar14 = iVar14 + -2;
          ppcVar10 = ppcVar10 + 2;
          iVar3 = 0;
        }
      }
LAB_001027a4:
      iVar2 = (int)uVar16;
    } while (iVar3 == 0);
    if (iVar3 == 3) {
LAB_00102895:
      uVar16 = local_58;
      pcVar12 = local_60;
      dVar1 = local_68;
      iVar14 = SUB84(local_68,0);
      if (iVar2 == 1) {
        if (iVar14 == 8) {
          uVar9 = 0x1100;
        }
        else if (iVar14 == 0x20) {
          uVar9 = 0x10010;
        }
        else if (iVar14 == 0x10) {
          uVar9 = 0x1101;
        }
        else {
          uVar9 = 0;
        }
      }
      else {
        uVar9 = 0;
        if (iVar2 == 2) {
          if (iVar14 == 8) {
            uVar9 = 0x1102;
          }
          else if (iVar14 == 0x20) {
            uVar9 = 0x10011;
          }
          else if (iVar14 == 0x10) {
            uVar9 = 0x1103;
          }
        }
      }
      lVar4 = alcCaptureOpenDevice(local_60,local_58 & 0xffffffff,uVar9,0x8000);
      pFVar5 = _stderr;
      if (lVar4 == 0) {
        pcVar8 = "default device";
        if (pcVar12 != (char *)0x0) {
          pcVar8 = pcVar12;
        }
        pcVar12 = "Signed";
        if (iVar14 == 8) {
          pcVar12 = "Unsigned";
        }
        pcVar13 = "Float";
        if (iVar14 != 0x20) {
          pcVar13 = pcVar12;
        }
        pcVar12 = "Stereo";
        if (iVar2 == 1) {
          pcVar12 = "Mono";
        }
        fprintf(_stderr,"Failed to open %s, %s %d-bit, %s, %dhz (%d samples)\n",pcVar8,pcVar13,
                (ulong)dVar1 & 0xffffffff,pcVar12,uVar16,0x8000);
      }
      else {
        uVar9 = alcGetString(lVar4,0x310);
        fprintf(pFVar5,"Opened \"%s\"\n",uVar9);
        pcVar12 = local_40;
        pFVar5 = fopen(local_40,"wb");
        if (pFVar5 == (FILE *)0x0) {
          fprintf(_stderr,"Failed to open \'%s\' for writing\n",pcVar12);
          alcCaptureCloseDevice(lVar4);
        }
        else {
          uVar15 = iVar2 * local_68._0_4_;
          uVar11 = uVar15 >> 3;
          local_60 = (char *)lVar4;
          fputs("RIFF",pFVar5);
          end._0_1_ = 0xff;
          end._1_1_ = 0xff;
          end._2_2_ = 0xffff;
          fwrite(&end,1,4,pFVar5);
          fputs("WAVE",pFVar5);
          fputs("fmt ",pFVar5);
          end._0_1_ = 0x12;
          end._1_1_ = 0;
          end._2_2_ = 0;
          fwrite(&end,1,4,pFVar5);
          end._0_1_ = (local_68._0_4_ == 0x20) * '\x02' + '\x01';
          end._1_1_ = 0;
          fwrite(&end,1,2,pFVar5);
          end._0_1_ = (char)iVar2;
          end._1_1_ = (undefined1)((uint)iVar2 >> 8);
          fwrite(&end,1,2,pFVar5);
          end._0_1_ = (char)uVar16;
          end._1_1_ = (undefined1)(uVar16 >> 8);
          end._2_2_ = (undefined2)(uVar16 >> 0x10);
          fwrite(&end,1,4,pFVar5);
          iVar14 = uVar11 * (int)uVar16;
          end._0_1_ = (char)iVar14;
          end._1_1_ = (undefined1)((uint)iVar14 >> 8);
          end._2_2_ = (undefined2)((uint)iVar14 >> 0x10);
          fwrite(&end,1,4,pFVar5);
          dVar1 = local_68;
          local_48 = (char *)CONCAT44(local_48._4_4_,uVar11);
          end._0_1_ = (char)uVar11;
          end._1_1_ = (undefined1)(uVar15 >> 0xb);
          fwrite(&end,1,2,pFVar5);
          end._0_1_ = SUB81(dVar1,0);
          end._1_1_ = (undefined1)((ulong)dVar1 >> 8);
          fwrite(&end,1,2,pFVar5);
          end._0_1_ = 0;
          end._1_1_ = 0;
          fwrite(&end,1,2,pFVar5);
          fputs("data",pFVar5);
          end._0_1_ = 0xff;
          end._1_1_ = 0xff;
          end._2_2_ = 0xffff;
          fwrite(&end,1,4,pFVar5);
          lVar4 = ftell(pFVar5);
          iVar14 = ferror(pFVar5);
          uVar16 = local_58;
          if ((3 < lVar4) && (iVar14 == 0)) {
            pcVar12 = "Signed";
            if (SUB84(dVar1,0) == 8) {
              pcVar12 = "Unsigned";
            }
            pcVar8 = "Float";
            if (SUB84(dVar1,0) != 0x20) {
              pcVar8 = pcVar12;
            }
            pcVar12 = "Stereo";
            if (iVar2 == 1) {
              pcVar12 = "Mono";
            }
            local_70 = (double)local_4c;
            pcVar13 = "";
            if (local_4c != 1.0) {
              pcVar13 = "s";
            }
            if (NAN(local_4c)) {
              pcVar13 = "s";
            }
            local_38 = lVar4;
            fprintf(_stderr,"Recording \'%s\', %s %d-bit, %s, %dhz (%g second%s)\n",local_40,pcVar8,
                    (ulong)dVar1 & 0xffffffff,pcVar12,local_58,pcVar13);
            pcVar12 = local_60;
            alcCaptureStart(local_60);
            local_68 = (double)(uVar16 & 0xffffffff);
            if (local_70 <= 0.0 / local_68) {
              uVar11 = 0;
              iVar14 = 0;
              __ptr = (void *)0x0;
            }
            else {
              uVar16 = (ulong)local_48 & 0xffffffff;
              uVar11 = 0;
              local_58 = local_58 & 0xffffffff00000000;
              __ptr_00 = (void *)0x0;
              do {
                iVar14 = alcGetError(pcVar12);
                __ptr = __ptr_00;
                if (iVar14 != 0) break;
                iVar2 = ferror(pFVar5);
                iVar14 = 0;
                if (iVar2 != 0) break;
                end._0_1_ = 0;
                end._1_1_ = 0;
                end._2_2_ = 0;
                fprintf(_stderr,"\rCaptured %u samples",(ulong)uVar11);
                alcGetIntegerv(pcVar12,0x312,1,&end);
                iVar2 = CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end));
                if ((long)iVar2 < 1) {
                  al_nssleep(10000000);
                }
                else {
                  if ((int)local_58 < iVar2) {
                    __ptr = calloc(uVar16,(long)iVar2);
                    free(__ptr_00);
                    local_58 = CONCAT44(local_58._4_4_,
                                        CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)));
                  }
                  alcCaptureSamples(pcVar12,__ptr,CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)))
                  ;
                  sVar6 = fwrite(__ptr,uVar16,
                                 (ulong)CONCAT22(end._2_2_,CONCAT11(end._1_1_,(char)end)),pFVar5);
                  uVar11 = uVar11 + (int)sVar6;
                }
                __ptr_00 = __ptr;
              } while ((double)uVar11 / local_68 < local_70);
            }
            lVar4 = local_38 + -4;
            alcCaptureStop(pcVar12);
            fprintf(_stderr,"\rCaptured %u samples\n",(ulong)uVar11);
            if (iVar14 != 0) {
              main_cold_5();
            }
            alcCaptureCloseDevice(pcVar12);
            free(__ptr);
            lVar7 = ftell(pFVar5);
            iVar14 = fseek(pFVar5,lVar4,0);
            if (iVar14 == 0) {
              fwrite32le(uVar11 * (int)local_48,(FILE *)pFVar5);
              iVar14 = fseek(pFVar5,4,0);
              if (iVar14 == 0) {
                fwrite32le((int)lVar7 - 8,(FILE *)pFVar5);
              }
            }
            fclose(pFVar5);
            return 0;
          }
          main_cold_6();
        }
      }
      iVar14 = 1;
    }
    else {
      iVar14 = (int)local_70;
    }
  }
  return iVar14;
}

Assistant:

int main(int argc, char **argv)
{
    static const char optlist[] =
"    --channels/-c <channels>  Set channel count (1 or 2)\n"
"    --bits/-b <bits>          Set channel count (8, 16, or 32)\n"
"    --rate/-r <rate>          Set sample rate (8000 to 96000)\n"
"    --time/-t <time>          Time in seconds to record (1 to 10)\n"
"    --outfile/-o <filename>   Output filename (default: record.wav)";
    const char *fname = "record.wav";
    const char *devname = NULL;
    const char *progname;
    Recorder recorder;
    long total_size;
    ALenum format;
    ALCenum err;

    progname = argv[0];
    if(argc < 2)
    {
        fprintf(stderr, "Record from a device to a wav file.\n\n"
                "Usage: %s [-device <name>] [options...]\n\n"
                "Available options:\n%s\n", progname, optlist);
        return 0;
    }

    recorder.mDevice = NULL;
    recorder.mFile = NULL;
    recorder.mDataSizeOffset = 0;
    recorder.mDataSize = 0;
    recorder.mRecTime = 4.0f;
    recorder.mChannels = 1;
    recorder.mBits = 16;
    recorder.mSampleRate = 44100;
    recorder.mFrameSize = recorder.mChannels * recorder.mBits / 8;
    recorder.mBuffer = NULL;
    recorder.mBufferSize = 0;

    argv++; argc--;
    if(argc > 1 && strcmp(argv[0], "-device") == 0)
    {
        devname = argv[1];
        argv += 2;
        argc -= 2;
    }

    while(argc > 0)
    {
        char *end;
        if(strcmp(argv[0], "--") == 0)
            break;
        else if(strcmp(argv[0], "--channels") == 0 || strcmp(argv[0], "-c") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mChannels = (ALuint)strtoul(argv[1], &end, 0);
            if((recorder.mChannels != 1 && recorder.mChannels != 2) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid channels: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--bits") == 0 || strcmp(argv[0], "-b") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mBits = (ALuint)strtoul(argv[1], &end, 0);
            if((recorder.mBits != 8 && recorder.mBits != 16 && recorder.mBits != 32) ||
               (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid bit count: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--rate") == 0 || strcmp(argv[0], "-r") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mSampleRate = (ALuint)strtoul(argv[1], &end, 0);
            if(!(recorder.mSampleRate >= 8000 && recorder.mSampleRate <= 96000) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid sample rate: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--time") == 0 || strcmp(argv[0], "-t") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            recorder.mRecTime = strtof(argv[1], &end);
            if(!(recorder.mRecTime >= 1.0f && recorder.mRecTime <= 10.0f) || (end && *end != '\0'))
            {
                fprintf(stderr, "Invalid record time: %s\n", argv[1]);
                return 1;
            }
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--outfile") == 0 || strcmp(argv[0], "-o") == 0)
        {
            if(argc < 2)
            {
                fprintf(stderr, "Missing argument for option: %s\n", argv[0]);
                return 1;
            }

            fname = argv[1];
            argv += 2;
            argc -= 2;
        }
        else if(strcmp(argv[0], "--help") == 0 || strcmp(argv[0], "-h") == 0)
        {
            fprintf(stderr, "Record from a device to a wav file.\n\n"
                    "Usage: %s [-device <name>] [options...]\n\n"
                    "Available options:\n%s\n", progname, optlist);
            return 0;
        }
        else
        {
            fprintf(stderr, "Invalid option '%s'.\n\n"
                    "Usage: %s [-device <name>] [options...]\n\n"
                    "Available options:\n%s\n", argv[0], progname, optlist);
            return 0;
        }
    }

    recorder.mFrameSize = recorder.mChannels * recorder.mBits / 8;

    format = AL_NONE;
    if(recorder.mChannels == 1)
    {
        if(recorder.mBits == 8)
            format = AL_FORMAT_MONO8;
        else if(recorder.mBits == 16)
            format = AL_FORMAT_MONO16;
        else if(recorder.mBits == 32)
            format = AL_FORMAT_MONO_FLOAT32;
    }
    else if(recorder.mChannels == 2)
    {
        if(recorder.mBits == 8)
            format = AL_FORMAT_STEREO8;
        else if(recorder.mBits == 16)
            format = AL_FORMAT_STEREO16;
        else if(recorder.mBits == 32)
            format = AL_FORMAT_STEREO_FLOAT32;
    }

    recorder.mDevice = alcCaptureOpenDevice(devname, recorder.mSampleRate, format, 32768);
    if(!recorder.mDevice)
    {
        fprintf(stderr, "Failed to open %s, %s %d-bit, %s, %dhz (%d samples)\n",
            devname ? devname : "default device",
            (recorder.mBits == 32) ? "Float" :
            (recorder.mBits !=  8) ? "Signed" : "Unsigned", recorder.mBits,
            (recorder.mChannels == 1) ? "Mono" : "Stereo", recorder.mSampleRate,
            32768
        );
        return 1;
    }
    fprintf(stderr, "Opened \"%s\"\n", alcGetString(
        recorder.mDevice, ALC_CAPTURE_DEVICE_SPECIFIER
    ));

    recorder.mFile = fopen(fname, "wb");
    if(!recorder.mFile)
    {
        fprintf(stderr, "Failed to open '%s' for writing\n", fname);
        alcCaptureCloseDevice(recorder.mDevice);
        return 1;
    }

    fputs("RIFF", recorder.mFile);
    fwrite32le(0xFFFFFFFF, recorder.mFile); // 'RIFF' header len; filled in at close

    fputs("WAVE", recorder.mFile);

    fputs("fmt ", recorder.mFile);
    fwrite32le(18, recorder.mFile); // 'fmt ' header len

    // 16-bit val, format type id (1 = integer PCM, 3 = float PCM)
    fwrite16le((recorder.mBits == 32) ? 0x0003 : 0x0001, recorder.mFile);
    // 16-bit val, channel count
    fwrite16le((ALushort)recorder.mChannels, recorder.mFile);
    // 32-bit val, frequency
    fwrite32le(recorder.mSampleRate, recorder.mFile);
    // 32-bit val, bytes per second
    fwrite32le(recorder.mSampleRate * recorder.mFrameSize, recorder.mFile);
    // 16-bit val, frame size
    fwrite16le((ALushort)recorder.mFrameSize, recorder.mFile);
    // 16-bit val, bits per sample
    fwrite16le((ALushort)recorder.mBits, recorder.mFile);
    // 16-bit val, extra byte count
    fwrite16le(0, recorder.mFile);

    fputs("data", recorder.mFile);
    fwrite32le(0xFFFFFFFF, recorder.mFile); // 'data' header len; filled in at close

    recorder.mDataSizeOffset = ftell(recorder.mFile) - 4;
    if(ferror(recorder.mFile) || recorder.mDataSizeOffset < 0)
    {
        fprintf(stderr, "Error writing header: %s\n", strerror(errno));
        fclose(recorder.mFile);
        alcCaptureCloseDevice(recorder.mDevice);
        return 1;
    }

    fprintf(stderr, "Recording '%s', %s %d-bit, %s, %dhz (%g second%s)\n", fname,
        (recorder.mBits == 32) ? "Float" :
        (recorder.mBits !=  8) ? "Signed" : "Unsigned", recorder.mBits,
        (recorder.mChannels == 1) ? "Mono" : "Stereo", recorder.mSampleRate,
        recorder.mRecTime, (recorder.mRecTime != 1.0f) ? "s" : ""
    );

    err = ALC_NO_ERROR;
    alcCaptureStart(recorder.mDevice);
    while((double)recorder.mDataSize/(double)recorder.mSampleRate < recorder.mRecTime &&
          (err=alcGetError(recorder.mDevice)) == ALC_NO_ERROR && !ferror(recorder.mFile))
    {
        ALCint count = 0;
        fprintf(stderr, "\rCaptured %u samples", recorder.mDataSize);
        alcGetIntegerv(recorder.mDevice, ALC_CAPTURE_SAMPLES, 1, &count);
        if(count < 1)
        {
            al_nssleep(10000000);
            continue;
        }
        if(count > recorder.mBufferSize)
        {
            ALbyte *data = calloc(recorder.mFrameSize, (ALuint)count);
            free(recorder.mBuffer);
            recorder.mBuffer = data;
            recorder.mBufferSize = count;
        }
        alcCaptureSamples(recorder.mDevice, recorder.mBuffer, count);
#if defined(__BYTE_ORDER) && __BYTE_ORDER == __BIG_ENDIAN
        /* Byteswap multibyte samples on big-endian systems (wav needs little-
         * endian, and OpenAL gives the system's native-endian).
         */
        if(recorder.mBits == 16)
        {
            ALCint i;
            for(i = 0;i < count*recorder.mChannels;i++)
            {
                ALbyte b = recorder.mBuffer[i*2 + 0];
                recorder.mBuffer[i*2 + 0] = recorder.mBuffer[i*2 + 1];
                recorder.mBuffer[i*2 + 1] = b;
            }
        }
        else if(recorder.mBits == 32)
        {
            ALCint i;
            for(i = 0;i < count*recorder.mChannels;i++)
            {
                ALbyte b0 = recorder.mBuffer[i*4 + 0];
                ALbyte b1 = recorder.mBuffer[i*4 + 1];
                recorder.mBuffer[i*4 + 0] = recorder.mBuffer[i*4 + 3];
                recorder.mBuffer[i*4 + 1] = recorder.mBuffer[i*4 + 2];
                recorder.mBuffer[i*4 + 2] = b1;
                recorder.mBuffer[i*4 + 3] = b0;
            }
        }
#endif
        recorder.mDataSize += (ALuint)fwrite(recorder.mBuffer, recorder.mFrameSize, (ALuint)count,
                                             recorder.mFile);
    }
    alcCaptureStop(recorder.mDevice);
    fprintf(stderr, "\rCaptured %u samples\n", recorder.mDataSize);
    if(err != ALC_NO_ERROR)
        fprintf(stderr, "Got device error 0x%04x: %s\n", err, alcGetString(recorder.mDevice, err));

    alcCaptureCloseDevice(recorder.mDevice);
    recorder.mDevice = NULL;

    free(recorder.mBuffer);
    recorder.mBuffer = NULL;
    recorder.mBufferSize = 0;

    total_size = ftell(recorder.mFile);
    if(fseek(recorder.mFile, recorder.mDataSizeOffset, SEEK_SET) == 0)
    {
        fwrite32le(recorder.mDataSize*recorder.mFrameSize, recorder.mFile);
        if(fseek(recorder.mFile, 4, SEEK_SET) == 0)
            fwrite32le((ALuint)total_size - 8, recorder.mFile);
    }

    fclose(recorder.mFile);
    recorder.mFile = NULL;

    return 0;
}